

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::find_position<std::pair<int,int>>
          (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,pair<int,_int> *key)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  
  iVar1 = key->first;
  *(int *)(this + 4) = *(int *)(this + 4) + 1;
  uVar3 = *(long *)(this + 0x60) - 1U & (long)iVar1;
  iVar4 = *(int *)(this + 0x38);
  iVar8 = *(int *)(*(long *)(this + 0x78) + uVar3 * 8);
  iVar6 = iVar4 + 1;
  uVar2 = 0xffffffffffffffff;
  if (*(int *)(this + 0x44) == iVar8) {
    uVar5 = 0xffffffffffffffff;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    lVar7 = 1;
    do {
      if ((*(long *)(this + 0x50) == 0) ||
         (iVar4 = iVar4 + 2, iVar6 = iVar4, *(int *)(this + 0x3c) != iVar8)) {
        iVar4 = iVar6 + 1;
        if (iVar1 == iVar8) {
          *(int *)(this + 0x38) = iVar4;
          uVar2 = uVar3;
          uVar3 = 0xffffffffffffffff;
          goto LAB_0065c3d9;
        }
      }
      else if (uVar5 == 0xffffffffffffffff) {
        uVar5 = uVar3;
      }
      uVar3 = uVar3 + lVar7 & *(long *)(this + 0x60) - 1U;
      iVar8 = *(int *)(*(long *)(this + 0x78) + uVar3 * 8);
      iVar6 = iVar4 + 1;
      lVar7 = lVar7 + 1;
    } while (*(int *)(this + 0x44) != iVar8);
  }
  *(int *)(this + 0x38) = iVar6;
  if (uVar5 != 0xffffffffffffffff) {
    uVar3 = uVar5;
  }
LAB_0065c3d9:
  pVar9.second = uVar3;
  pVar9.first = uVar2;
  return pVar9;
}

Assistant:

size_type bucket_count() const { return num_buckets; }